

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O1

void __thiscall
ExampleNLFeeder::
FeedDefinedVariables<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::DefVarWriterFactory>
          (ExampleNLFeeder *this,int i,DefVarWriterFactory *dvw)

{
  double (*padVar1) [2];
  double dVar2;
  int i_00;
  ExampleModel *pEVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int *piVar6;
  uint uVar7;
  undefined8 extraout_RDX;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this_00;
  undefined8 extraout_RDX_00;
  ulong uVar8;
  DefVarWriter DVar9;
  ExprArgWriter ew;
  vector<int,_std::allocator<int>_> local_58;
  ExprArgWriter local_40;
  
  ExampleModel::DefVarsInItem(&local_58,this->mdl_,i);
  uVar5 = extraout_RDX;
  for (piVar6 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
    i_00 = *piVar6;
    padVar1 = this->mdl_->dvar_linpart + i_00;
    auVar4._8_8_ = -(ulong)((*padVar1)[1] != 0.0);
    auVar4._0_8_ = -(ulong)((*padVar1)[0] != 0.0);
    uVar7 = movmskpd((int)uVar5,auVar4);
    DVar9 = mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
            DefVarWriterFactory::StartDefVar
                      (dvw,i_00 + 2,uVar7 - (uVar7 >> 1),this->mdl_->dvar_name[i_00]);
    this_00 = DVar9.nlw_;
    pEVar3 = this->mdl_;
    uVar8 = 0;
    do {
      dVar2 = pEVar3->dvar_linpart[i_00][uVar8];
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        mp::BinaryFormatter::apr
                  (&this_00->super_FormatterType,&this_00->nm,"%d %g\n",uVar8 & 0xffffffff);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 == 1);
    local_40.nargs_ = 1;
    local_40.nlw_ = this_00;
    ExampleModel::
    WriteDVarExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
              (this->mdl_,i_00,&local_40);
    uVar5 = extraout_RDX_00;
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FeedDefinedVariables(int i, DefVarWriterFactory& dvw) {
    for (int dvar0: Model().DefVarsInItem(i)) {
      int lin_nnz = CountNNZ(Model().dvar_linpart[dvar0]);
      auto dv = dvw.StartDefVar(
            dvar0 + Model().n_var,  // index after direct vars
            lin_nnz, Model().dvar_name[dvar0]);
      /////////// Write the linear part:
      auto linw = dv.GetLinExprWriter();
      WriteDense2Sparse_Pure(linw,
                             Model().dvar_linpart[dvar0]);
      /////////// Write the expression tree:
      auto ew = dv.GetExprWriter();
      Model().WriteDVarExpr(dvar0, ew);
    }
  }